

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_ZeroRTTReject_Test::TestBody
          (QUICMethodTest_ZeroRTTReject_Test *this)

{
  MockQUICTransportPair *pMVar1;
  internal iVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr;
  bool bVar7;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int err;
  ScopedTrace gtest_trace_7623;
  bool reject_hrr;
  UniquePtr<SSL_SESSION> session;
  int p256;
  SSL_QUIC_METHOD quic_method;
  int local_b0;
  undefined4 uStack_ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  AssertHelper local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  AssertHelper local_78;
  ScopedTrace local_6a;
  bool local_69;
  undefined1 local_68 [24];
  code *local_50;
  code *local_48;
  code *local_40;
  code *local_38;
  
  local_68._16_8_ = QUICMethodTest::SetReadSecretCallback;
  local_50 = QUICMethodTest::SetWriteSecretCallback;
  local_48 = QUICMethodTest::AddHandshakeDataCallback;
  local_40 = QUICMethodTest::FlushFlightCallback;
  local_38 = QUICMethodTest::SendAlertCallback;
  SSL_CTX_set_session_cache_mode
            ((this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  SSL_CTX_set_early_data_enabled
            ((this->super_QUICMethodTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1);
  SSL_CTX_set_early_data_enabled
            ((this->super_QUICMethodTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1);
  iVar4 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (SSL_QUIC_METHOD *)(local_68 + 0x10));
  iVar2 = (internal)(iVar4 != 0);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b0._0_1_ = iVar2;
  if (iVar4 == 0) {
    testing::Message::Message((Message *)local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_b0,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1dc0,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_68);
  }
  else {
    iVar4 = SSL_CTX_set_quic_method
                      ((this->super_QUICMethodTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (SSL_QUIC_METHOD *)(local_68 + 0x10));
    local_b0._0_1_ = (internal)(iVar4 != 0);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_b0._0_1_) {
      QUICMethodTest::CreateClientSessionForQUIC((QUICMethodTest *)local_68);
      local_b0 = CONCAT31(local_b0._1_3_,
                          (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )local_68._0_8_ !=
                          (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )0x0);
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_68._0_8_ ==
          (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        testing::Message::Message((Message *)&local_a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_98,(internal *)&local_b0,(AssertionResult *)0x35c794,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1dc4,(char *)CONCAT71(local_98._1_7_,local_98[0]));
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1
                         );
        }
        if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
        }
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_a8,local_a8);
        }
      }
      else {
        local_68._10_2_ = 0x100;
        lVar5 = 0;
        do {
          local_69 = (bool)local_68[lVar5 + 10];
          testing::ScopedTrace::ScopedTrace<bool>
                    (&local_6a,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1dc7,&local_69);
          bVar3 = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
          local_b0 = CONCAT31(local_b0._1_3_,bVar3);
          local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!bVar3) {
            testing::Message::Message((Message *)&local_a0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,(internal *)&local_b0,
                       (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1dc9,(char *)CONCAT71(local_98._1_7_,local_98[0]));
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_98._1_7_,local_98[0]),
                              local_88._M_allocated_capacity + 1);
            }
            if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
            }
            if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a8,local_a8);
            }
            bVar7 = true;
            if (bVar3) goto LAB_001c3351;
            goto LAB_001c42cb;
          }
LAB_001c3351:
          if (local_69 == true) {
            local_68._12_4_ = 0x19f;
            iVar4 = SSL_set1_groups((this->super_QUICMethodTest).server_._M_t.
                                    super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                    (int *)(local_68 + 0xc),1);
            local_b0 = CONCAT31(local_b0._1_3_,iVar4 != 0);
            local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar4 != 0) goto LAB_001c3441;
            testing::Message::Message((Message *)&local_a0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,(internal *)&local_b0,
                       (AssertionResult *)"SSL_set1_groups(server_.get(), &p256, 1)","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1dce,(char *)CONCAT71(local_98._1_7_,local_98[0]));
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_98._1_7_,local_98[0]),
                              local_88._M_allocated_capacity + 1);
            }
            if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
            }
            if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_a8;
              __ptr_00 = local_a8;
LAB_001c42c3:
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()(this_00,__ptr_00);
            }
LAB_001c42c8:
            bVar7 = true;
          }
          else {
            SSL_set_early_data_enabled
                      ((this->super_QUICMethodTest).server_._M_t.
                       super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0);
LAB_001c3441:
            SSL_set_session((SSL *)(this->super_QUICMethodTest).client_._M_t.
                                   super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                            (SSL_SESSION *)local_68._0_8_);
            local_b0 = SSL_do_handshake((SSL *)(this->super_QUICMethodTest).client_._M_t.
                                               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl)
            ;
            local_a0.data_._0_4_ = 1;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_98,"SSL_do_handshake(client_.get())","1",&local_b0,
                       (int *)&local_a0);
            if (local_98[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_b0);
              pcVar6 = "";
              if (local_90 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = (local_90->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_a0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1dd6,pcVar6);
              testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
LAB_001c429c:
              testing::internal::AssertHelper::~AssertHelper(&local_a0);
              if ((long *)CONCAT44(uStack_ac,local_b0) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(uStack_ac,local_b0) + 8))();
              }
              if (local_90 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_90;
                __ptr_00 = local_90;
                goto LAB_001c42c3;
              }
              goto LAB_001c42c8;
            }
            if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_90,local_90);
            }
            iVar4 = SSL_in_early_data((this->super_QUICMethodTest).client_._M_t.
                                      super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            local_b0 = CONCAT31(local_b0._1_3_,iVar4 != 0);
            local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar4 == 0) {
              testing::Message::Message((Message *)&local_a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,(internal *)&local_b0,
                         (AssertionResult *)"SSL_in_early_data(client_.get())","false","true",in_R9)
              ;
              testing::internal::AssertHelper::AssertHelper
                        (&local_78,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1dd7,(char *)CONCAT71(local_98._1_7_,local_98[0]));
              testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
              testing::internal::AssertHelper::~AssertHelper(&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_98._1_7_,local_98[0]),
                                local_88._M_allocated_capacity + 1);
              }
              if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
              }
            }
            if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a8,local_a8);
            }
            pMVar1 = (this->super_QUICMethodTest).transport_._M_t.
                     super___uniq_ptr_impl<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                     .
                     super__Head_base<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_false>
                     ._M_head_impl;
            bVar3 = *(pointer *)
                     &(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)(pMVar1->client_).levels_ + 0x68))->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl !=
                    *(pointer *)((long)(pMVar1->client_).levels_ + 0x70);
            local_b0 = CONCAT31(local_b0._1_3_,bVar3);
            local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar3) {
              testing::Message::Message((Message *)&local_a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,(internal *)&local_b0,
                         (AssertionResult *)
                         "transport_->client()->HasWriteSecret(ssl_encryption_early_data)","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_78,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1dda,(char *)CONCAT71(local_98._1_7_,local_98[0]));
              testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
              testing::internal::AssertHelper::~AssertHelper(&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_98._1_7_,local_98[0]),
                                local_88._M_allocated_capacity + 1);
              }
              if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
              }
            }
            if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a8,local_a8);
            }
            bVar3 = QUICMethodTest::ProvideHandshakeData
                              ((this->super_QUICMethodTest).server_._M_t.
                               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                               0xffffffffffffffff);
            local_b0 = CONCAT31(local_b0._1_3_,bVar3);
            local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar3) {
              testing::Message::Message((Message *)&local_a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,(internal *)&local_b0,
                         (AssertionResult *)"ProvideHandshakeData(server_.get())","false","true",
                         in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_78,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1ddd,(char *)CONCAT71(local_98._1_7_,local_98[0]));
              testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
              testing::internal::AssertHelper::~AssertHelper(&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_98._1_7_,local_98[0]),
                                local_88._M_allocated_capacity + 1);
              }
              if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
              }
              if (local_a8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_a8,local_a8);
              }
              bVar7 = true;
              if (!bVar3) goto LAB_001c42cb;
            }
            local_b0 = SSL_do_handshake((SSL *)(this->super_QUICMethodTest).server_._M_t.
                                               super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl)
            ;
            local_a0.data_._0_4_ = -1;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_98,"SSL_do_handshake(server_.get())","-1",&local_b0,
                       (int *)&local_a0);
            if (local_98[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_b0);
              pcVar6 = "";
              if (local_90 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = (local_90->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_a0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1dde,pcVar6);
              testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
              goto LAB_001c429c;
            }
            if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_90,local_90);
            }
            local_b0 = 2;
            local_a0.data_._0_4_ =
                 SSL_get_error((SSL *)(this->super_QUICMethodTest).server_._M_t.
                                      super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_98,"2","SSL_get_error(server_.get(), -1)",&local_b0,
                       (int *)&local_a0);
            if (local_98[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_b0);
              pcVar6 = "";
              if (local_90 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar6 = (local_90->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_a0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1ddf,pcVar6);
              testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
              goto LAB_001c429c;
            }
            if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_90,local_90);
            }
            iVar4 = SSL_in_early_data((this->super_QUICMethodTest).server_._M_t.
                                      super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            local_b0 = CONCAT31(local_b0._1_3_,iVar4 == 0);
            local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar4 != 0) {
              testing::Message::Message((Message *)&local_a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,(internal *)&local_b0,
                         (AssertionResult *)"SSL_in_early_data(server_.get())","true","false",in_R9)
              ;
              testing::internal::AssertHelper::AssertHelper
                        (&local_78,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1de0,(char *)CONCAT71(local_98._1_7_,local_98[0]));
              testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
              testing::internal::AssertHelper::~AssertHelper(&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_98._1_7_,local_98[0]),
                                local_88._M_allocated_capacity + 1);
              }
              if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
              }
            }
            if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a8,local_a8);
            }
            pMVar1 = (this->super_QUICMethodTest).transport_._M_t.
                     super___uniq_ptr_impl<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                     .
                     super__Head_base<0UL,_bssl::(anonymous_namespace)::MockQUICTransportPair_*,_false>
                     ._M_head_impl;
            bVar3 = *(pointer *)
                     &(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)(pMVar1->server_).levels_ + 0x80))->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl ==
                    *(pointer *)((long)(pMVar1->server_).levels_ + 0x88);
            local_b0 = CONCAT31(local_b0._1_3_,bVar3);
            local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar3) {
              testing::Message::Message((Message *)&local_a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,(internal *)&local_b0,
                         (AssertionResult *)
                         "transport_->server()->HasReadSecret(ssl_encryption_early_data)","true",
                         "false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_78,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1de2,(char *)CONCAT71(local_98._1_7_,local_98[0]));
              testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
              testing::internal::AssertHelper::~AssertHelper(&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_98._1_7_,local_98[0]),
                                local_88._M_allocated_capacity + 1);
              }
              if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
              }
            }
            if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_a8,local_a8);
            }
            do {
              bVar3 = QUICMethodTest::ProvideHandshakeData
                                ((this->super_QUICMethodTest).client_._M_t.
                                 super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                 0xffffffffffffffff);
              local_b0 = CONCAT31(local_b0._1_3_,bVar3);
              local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!bVar3) {
                testing::Message::Message((Message *)&local_a0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_98,(internal *)&local_b0,
                           (AssertionResult *)"ProvideHandshakeData(client_.get())","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_78,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1de6,(char *)CONCAT71(local_98._1_7_,local_98[0]));
                testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
                testing::internal::AssertHelper::~AssertHelper(&local_78);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_98._1_7_,local_98[0]),
                                  local_88._M_allocated_capacity + 1);
                }
                if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
                }
                if (local_a8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_a8,local_a8);
                }
                if (!bVar3) {
                  iVar4 = 1;
                  goto LAB_001c420e;
                }
              }
              local_b0 = -1;
              local_a0.data_._0_4_ =
                   SSL_do_handshake((SSL *)(this->super_QUICMethodTest).client_._M_t.
                                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_98,"-1","SSL_do_handshake(client_.get())",&local_b0,
                         (int *)&local_a0);
              if (local_98[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_b0);
                pcVar6 = "";
                if (local_90 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_90->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1de7,pcVar6);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
                goto LAB_001c429c;
              }
              if (local_90 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_90,local_90);
              }
              local_78.data_._0_4_ =
                   SSL_get_error((SSL *)(this->super_QUICMethodTest).client_._M_t.
                                        super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
              iVar4 = 4;
              if ((int)local_78.data_ != 0xf) {
                local_b0 = 2;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_98,"2","err",&local_b0,(int *)&local_78);
                iVar4 = 0;
                if (local_98[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_b0);
                  pcVar6 = "";
                  if (local_90 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar6 = (local_90->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_a0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1dec,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper(&local_a0);
                  if ((long *)CONCAT44(uStack_ac,local_b0) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(uStack_ac,local_b0) + 8))();
                  }
                  iVar4 = 1;
                }
                if (local_90 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_90,local_90);
                }
              }
            } while (iVar4 == 0);
            if (iVar4 == 4) {
              local_b0 = -1;
              local_a0.data_._0_4_ =
                   SSL_do_handshake((SSL *)(this->super_QUICMethodTest).client_._M_t.
                                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_98,"-1","SSL_do_handshake(client_.get())",&local_b0,
                         (int *)&local_a0);
              if (local_98[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_b0);
                pcVar6 = "";
                if (local_90 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_90->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1df0,pcVar6);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
              }
              else {
                if (local_90 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_90,local_90);
                }
                local_b0 = 0xf;
                local_a0.data_._0_4_ =
                     SSL_get_error((SSL *)(this->super_QUICMethodTest).client_._M_t.
                                          super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,-1);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_98,"15","SSL_get_error(client_.get(), -1)",&local_b0,
                           (int *)&local_a0);
                if (local_98[0] != (internal)0x0) {
                  if (local_90 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_90,local_90);
                  }
                  SSL_reset_early_data_reject
                            ((this->super_QUICMethodTest).client_._M_t.
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                  bVar3 = QUICMethodTest::RunQUICHandshakesAndExpectError
                                    (&this->super_QUICMethodTest,kNoError);
                  local_b0 = CONCAT31(local_b0._1_3_,bVar3);
                  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (!bVar3) {
                    testing::Message::Message((Message *)&local_a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_98,(internal *)&local_b0,
                               (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9
                              );
                    testing::internal::AssertHelper::AssertHelper
                              (&local_78,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1df5,(char *)CONCAT71(local_98._1_7_,local_98[0]));
                    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
                    testing::internal::AssertHelper::~AssertHelper(&local_78);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_98._1_7_,local_98[0]),
                                      local_88._M_allocated_capacity + 1);
                    }
                    if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))
                                ();
                    }
                    if (local_a8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_a8,local_a8);
                    }
                    bVar7 = true;
                    if (!bVar3) goto LAB_001c42cb;
                  }
                  QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
                  iVar4 = SSL_session_reused((this->super_QUICMethodTest).client_._M_t.
                                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                             _M_t.
                                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                  local_b0 = CONCAT31(local_b0._1_3_,iVar4 != 0);
                  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar4 == 0) {
                    testing::Message::Message((Message *)&local_a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_98,(internal *)&local_b0,
                               (AssertionResult *)"SSL_session_reused(client_.get())","false","true"
                               ,in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_78,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1df9,(char *)CONCAT71(local_98._1_7_,local_98[0]));
                    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
                    testing::internal::AssertHelper::~AssertHelper(&local_78);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_98._1_7_,local_98[0]),
                                      local_88._M_allocated_capacity + 1);
                    }
                    if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))
                                ();
                    }
                  }
                  if (local_a8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_a8,local_a8);
                  }
                  iVar4 = SSL_session_reused((this->super_QUICMethodTest).server_._M_t.
                                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                             _M_t.
                                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                  local_b0 = CONCAT31(local_b0._1_3_,iVar4 != 0);
                  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar4 == 0) {
                    testing::Message::Message((Message *)&local_a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_98,(internal *)&local_b0,
                               (AssertionResult *)"SSL_session_reused(server_.get())","false","true"
                               ,in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_78,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1dfa,(char *)CONCAT71(local_98._1_7_,local_98[0]));
                    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
                    testing::internal::AssertHelper::~AssertHelper(&local_78);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_98._1_7_,local_98[0]),
                                      local_88._M_allocated_capacity + 1);
                    }
                    if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))
                                ();
                    }
                  }
                  if (local_a8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_a8,local_a8);
                  }
                  iVar4 = SSL_in_early_data((this->super_QUICMethodTest).client_._M_t.
                                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                            _M_t.
                                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                  local_b0 = CONCAT31(local_b0._1_3_,iVar4 == 0);
                  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar4 != 0) {
                    testing::Message::Message((Message *)&local_a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_98,(internal *)&local_b0,
                               (AssertionResult *)"SSL_in_early_data(client_.get())","true","false",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_78,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1dfb,(char *)CONCAT71(local_98._1_7_,local_98[0]));
                    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
                    testing::internal::AssertHelper::~AssertHelper(&local_78);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_98._1_7_,local_98[0]),
                                      local_88._M_allocated_capacity + 1);
                    }
                    if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))
                                ();
                    }
                  }
                  if (local_a8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_a8,local_a8);
                  }
                  iVar4 = SSL_in_early_data((this->super_QUICMethodTest).server_._M_t.
                                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                            _M_t.
                                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                  local_b0 = CONCAT31(local_b0._1_3_,iVar4 == 0);
                  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar4 != 0) {
                    testing::Message::Message((Message *)&local_a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_98,(internal *)&local_b0,
                               (AssertionResult *)"SSL_in_early_data(server_.get())","true","false",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_78,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1dfc,(char *)CONCAT71(local_98._1_7_,local_98[0]));
                    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
                    testing::internal::AssertHelper::~AssertHelper(&local_78);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_98._1_7_,local_98[0]),
                                      local_88._M_allocated_capacity + 1);
                    }
                    if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))
                                ();
                    }
                  }
                  if (local_a8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_a8,local_a8);
                  }
                  iVar4 = SSL_early_data_accepted
                                    ((this->super_QUICMethodTest).client_._M_t.
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                  local_b0 = CONCAT31(local_b0._1_3_,iVar4 == 0);
                  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar4 != 0) {
                    testing::Message::Message((Message *)&local_a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_98,(internal *)&local_b0,
                               (AssertionResult *)"SSL_early_data_accepted(client_.get())","true",
                               "false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_78,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1dfd,(char *)CONCAT71(local_98._1_7_,local_98[0]));
                    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
                    testing::internal::AssertHelper::~AssertHelper(&local_78);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_98._1_7_,local_98[0]),
                                      local_88._M_allocated_capacity + 1);
                    }
                    if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))
                                ();
                    }
                  }
                  if (local_a8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_a8,local_a8);
                  }
                  iVar4 = SSL_early_data_accepted
                                    ((this->super_QUICMethodTest).server_._M_t.
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                  local_b0 = CONCAT31(local_b0._1_3_,iVar4 == 0);
                  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar4 != 0) {
                    testing::Message::Message((Message *)&local_a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_98,(internal *)&local_b0,
                               (AssertionResult *)"SSL_early_data_accepted(server_.get())","true",
                               "false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_78,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1dfe,(char *)CONCAT71(local_98._1_7_,local_98[0]));
                    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_a0);
                    testing::internal::AssertHelper::~AssertHelper(&local_78);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_98._1_7_,local_98[0]),
                                      local_88._M_allocated_capacity + 1);
                    }
                    if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))
                                ();
                    }
                  }
                  if (local_a8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_a8,local_a8);
                  }
                  bVar7 = false;
                  goto LAB_001c42cb;
                }
                testing::Message::Message((Message *)&local_b0);
                pcVar6 = "";
                if (local_90 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar6 = (local_90->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1df1,pcVar6);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
              }
              goto LAB_001c429c;
            }
LAB_001c420e:
            bVar7 = iVar4 != 0;
          }
LAB_001c42cb:
          testing::ScopedTrace::~ScopedTrace(&local_6a);
        } while ((!bVar7) && (lVar5 = lVar5 + 1, lVar5 != 2));
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_68);
      return;
    }
    testing::Message::Message((Message *)local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_b0,
               (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1dc1,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_68);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
  }
  if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_68._0_8_ !=
      (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)local_68._0_8_ + 8))();
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  return;
}

Assistant:

TEST_F(QUICMethodTest, ZeroRTTReject) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_early_data_enabled(client_ctx_.get(), 1);
  SSL_CTX_set_early_data_enabled(server_ctx_.get(), 1);
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  bssl::UniquePtr<SSL_SESSION> session = CreateClientSessionForQUIC();
  ASSERT_TRUE(session);

  for (bool reject_hrr : {false, true}) {
    SCOPED_TRACE(reject_hrr);

    ASSERT_TRUE(CreateClientAndServer());
    if (reject_hrr) {
      // Configure the server to prefer P-256, which will reject 0-RTT via
      // HelloRetryRequest.
      int p256 = NID_X9_62_prime256v1;
      ASSERT_TRUE(SSL_set1_groups(server_.get(), &p256, 1));
    } else {
      // Disable 0-RTT on the server, so it will reject it.
      SSL_set_early_data_enabled(server_.get(), 0);
    }
    SSL_set_session(client_.get(), session.get());

    // The client handshake should return immediately into the early data state.
    ASSERT_EQ(SSL_do_handshake(client_.get()), 1);
    EXPECT_TRUE(SSL_in_early_data(client_.get()));
    // The transport should have keys for sending 0-RTT data.
    EXPECT_TRUE(
        transport_->client()->HasWriteSecret(ssl_encryption_early_data));

    // The server will consume the ClientHello, but it will not accept 0-RTT.
    ASSERT_TRUE(ProvideHandshakeData(server_.get()));
    ASSERT_EQ(SSL_do_handshake(server_.get()), -1);
    ASSERT_EQ(SSL_ERROR_WANT_READ, SSL_get_error(server_.get(), -1));
    EXPECT_FALSE(SSL_in_early_data(server_.get()));
    EXPECT_FALSE(
        transport_->server()->HasReadSecret(ssl_encryption_early_data));

    // The client consumes the server response and signals 0-RTT rejection.
    for (;;) {
      ASSERT_TRUE(ProvideHandshakeData(client_.get()));
      ASSERT_EQ(-1, SSL_do_handshake(client_.get()));
      int err = SSL_get_error(client_.get(), -1);
      if (err == SSL_ERROR_EARLY_DATA_REJECTED) {
        break;
      }
      ASSERT_EQ(SSL_ERROR_WANT_READ, err);
    }

    // As in TLS over TCP, 0-RTT rejection is sticky.
    ASSERT_EQ(-1, SSL_do_handshake(client_.get()));
    ASSERT_EQ(SSL_ERROR_EARLY_DATA_REJECTED, SSL_get_error(client_.get(), -1));

    // Finish up the client and server handshakes.
    SSL_reset_early_data_reject(client_.get());
    ASSERT_TRUE(CompleteHandshakesForQUIC());

    // Both sides can now exchange 1-RTT data.
    ExpectHandshakeSuccess();
    EXPECT_TRUE(SSL_session_reused(client_.get()));
    EXPECT_TRUE(SSL_session_reused(server_.get()));
    EXPECT_FALSE(SSL_in_early_data(client_.get()));
    EXPECT_FALSE(SSL_in_early_data(server_.get()));
    EXPECT_FALSE(SSL_early_data_accepted(client_.get()));
    EXPECT_FALSE(SSL_early_data_accepted(server_.get()));
  }
}